

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.cpp
# Opt level: O0

string * rc::detail::makeWrongExceptionMessage
                   (string *__return_storage_ptr__,string *file,int line,string *assertion,
                   string *expected)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *expected_local;
  string *assertion_local;
  string *psStack_18;
  int line_local;
  string *file_local;
  
  local_30 = expected;
  expected_local = assertion;
  assertion_local._4_4_ = line;
  psStack_18 = file;
  file_local = __return_storage_ptr__;
  std::operator+(&local_70,"Thrown exception did not match ",expected);
  std::operator+(&local_50,&local_70,".");
  makeMessage(__return_storage_ptr__,file,line,assertion,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string makeWrongExceptionMessage(const std::string &file,
                                      int line,
                                      const std::string &assertion,
                                      const std::string &expected) {
  return makeMessage(file,
                     line,
                     assertion,
                     "Thrown exception did not match " + expected + ".");
}